

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiCutFab.cpp
# Opt level: O0

bool __thiscall amrex::MultiCutFab::ok(MultiCutFab *this,int global_box_index)

{
  FabType FVar1;
  EBCellFlagFab *this_00;
  undefined4 in_ESI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  this_00 = FabArray<amrex::EBCellFlagFab>::operator[]
                      ((FabArray<amrex::EBCellFlagFab> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
                       in_stack_ffffffffffffffec);
  FVar1 = EBCellFlagFab::getType(this_00);
  return FVar1 == singlevalued;
}

Assistant:

bool
MultiCutFab::ok (int global_box_index) const noexcept
{
    return (*m_cellflags)[global_box_index].getType() == FabType::singlevalued;
}